

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::cleanAll(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
           *this)

{
  int iVar1;
  Lit *pLVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = (this->dirties).sz;
  if (0 < iVar3) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pLVar2 = (this->dirties).data;
      iVar1 = *(int *)((long)&pLVar2->x + lVar4);
      if ((this->dirty).map.sz <= iVar1) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x28,
                      "V &Minisat::IntMap<Minisat::Lit, char, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = char, MkIndex = Minisat::MkIndexLit]"
                     );
      }
      if ((this->dirty).map.data[iVar1] != '\0') {
        clean(this,(Lit *)((long)&pLVar2->x + lVar4));
        iVar3 = (this->dirties).sz;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (lVar5 < iVar3);
  }
  if ((this->dirties).data != (Lit *)0x0) {
    (this->dirties).sz = 0;
  }
  return;
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::cleanAll()
{
    for (int i = 0; i < dirties.size(); i++)
        // Dirties may contain duplicates so check here if a variable is already cleaned:
        if (dirty[dirties[i]])
            clean(dirties[i]);
    dirties.clear();
}